

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_process_slice.c
# Opt level: O3

void ihevcd_slice_hdr_update(process_ctxt_t *ps_proc)

{
  slice_header_t *psVar1;
  uint uVar2;
  uint uVar3;
  
  if ((ps_proc->i4_ctb_x != 0) || (ps_proc->i4_ctb_y != 0)) {
    psVar1 = ps_proc->ps_codec->ps_slice_hdr_base;
    uVar2 = ps_proc->i4_cur_slice_idx + 1;
    uVar3 = uVar2 & 0xff;
    if ((ps_proc->i4_ctb_x == (int)psVar1[uVar3].i2_ctb_x) &&
       (psVar1 = psVar1 + uVar3, ps_proc->i4_ctb_y == (int)psVar1->i2_ctb_y)) {
      if (psVar1->i1_dependent_slice_flag == '\0') {
        ps_proc->i4_ctb_slice_x = 0;
        ps_proc->i4_ctb_slice_y = 0;
      }
      ps_proc->i4_cur_slice_idx = uVar2;
      ps_proc->ps_slice_hdr = psVar1;
    }
  }
  return;
}

Assistant:

void ihevcd_slice_hdr_update(process_ctxt_t *ps_proc)
{

    /* Slice x and y are initialized in proc_init. But initialize slice x and y count here
     *  if a new slice begins at the middle of a row since proc_init is invoked only at the beginning of each row */
    if(!((ps_proc->i4_ctb_x == 0) && (ps_proc->i4_ctb_y == 0)))
    {
        slice_header_t *ps_slice_hdr_next = ps_proc->ps_codec->ps_slice_hdr_base + ((ps_proc->i4_cur_slice_idx + 1) & (MAX_SLICE_HDR_CNT - 1));

        if((ps_slice_hdr_next->i2_ctb_x == ps_proc->i4_ctb_x)
                        && (ps_slice_hdr_next->i2_ctb_y == ps_proc->i4_ctb_y))
        {
            if(0 == ps_slice_hdr_next->i1_dependent_slice_flag)
            {
                ps_proc->i4_ctb_slice_x = 0;
                ps_proc->i4_ctb_slice_y = 0;
            }

            ps_proc->i4_cur_slice_idx++;
            ps_proc->ps_slice_hdr = ps_slice_hdr_next;
        }

    }
}